

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_145302::StaleFileRemovalCommand::execute
          (StaleFileRemovalCommand *this,BuildSystem *system,TaskInterface ti,
          QueueJobContext *context,ResultFn *resultFn)

{
  bool bVar1;
  uint uVar2;
  BuildSystemDelegate *pBVar3;
  reference pbVar4;
  size_type sVar5;
  char *pcVar6;
  long lVar7;
  BuildSystemImpl *this_00;
  FileSystem *pFVar8;
  int *piVar9;
  void *pvVar10;
  void *extraout_RDX;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> values;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  values_00;
  TaskInterface ti_00;
  BuildValue *local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c0;
  BuildValue local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  undefined8 local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined8 local_278;
  StaleFileRemovalCommand *local_268;
  void *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  undefined8 local_218;
  string local_208;
  string local_1e8;
  string local_1c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> root;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined8 local_148;
  byte local_131;
  undefined1 local_130 [7];
  bool isLocatedUnderRootPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileToDelete;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  BuildValue local_e8;
  ResultFn *local_78;
  ResultFn *resultFn_local;
  QueueJobContext *context_local;
  BuildSystem *system_local;
  StaleFileRemovalCommand *this_local;
  TaskInterface ti_local;
  
  pvVar10 = ti.ctx;
  this_local = (StaleFileRemovalCommand *)ti.impl;
  local_78 = resultFn;
  resultFn_local = (ResultFn *)context;
  context_local = (QueueJobContext *)system;
  system_local = (BuildSystem *)this;
  ti_local.impl = pvVar10;
  if (((this->hasPriorResult & 1U) == 0) ||
     (bVar1 = llbuild::buildsystem::BuildValue::isStaleFileRemoval(&this->priorValue), !bVar1)) {
    pBVar3 = llbuild::buildsystem::BuildSystem::getDelegate((BuildSystem *)context_local);
    (*pBVar3->_vptr_BuildSystemDelegate[10])(pBVar3,this);
    pBVar3 = llbuild::buildsystem::BuildSystem::getDelegate((BuildSystem *)context_local);
    (*pBVar3->_vptr_BuildSystemDelegate[0xe])(pBVar3,this,0);
    llvm::ArrayRef<std::__cxx11::string>::ArrayRef<std::allocator<std::__cxx11::string>>
              ((ArrayRef<std::__cxx11::string> *)&__range2,&this->expectedOutputs);
    values.Length = (size_type)pvVar10;
    values.Data = local_f0;
    llbuild::buildsystem::BuildValue::makeStaleFileRemoval(&local_e8,(BuildValue *)__range2,values);
    std::function<void_(llbuild::buildsystem::BuildValue_&&)>::operator()(resultFn,&local_e8);
    llbuild::buildsystem::BuildValue::~BuildValue(&local_e8);
  }
  else {
    computeFilesToDelete(this);
    pBVar3 = llbuild::buildsystem::BuildSystem::getDelegate((BuildSystem *)context_local);
    (*pBVar3->_vptr_BuildSystemDelegate[10])(pBVar3,this);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->filesToDelete);
    fileToDelete.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->filesToDelete);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)((long)&fileToDelete.field_2 + 8)), bVar1) {
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      std::__cxx11::string::string((string *)local_130,(string *)pbVar4);
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->roots);
      pvVar10 = (void *)(sVar5 - 1);
      local_131 = -(sVar5 == 0) & 1;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->roots);
      if (sVar5 == 0) {
LAB_0019725a:
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->roots);
        root.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->roots);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)((long)&root.field_2 + 8)), bVar1) {
          pbVar4 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end3);
          std::__cxx11::string::string(local_1c8,(string *)pbVar4);
          std::__cxx11::string::string((string *)&local_1e8,(string *)local_130);
          std::__cxx11::string::string((string *)&local_208,local_1c8);
          bVar1 = llbuild::buildsystem::pathIsPrefixedByPath(&local_1e8,&local_208);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::string::~string((string *)&local_1e8);
          if (bVar1) {
            local_131 = 1;
          }
          std::__cxx11::string::~string(local_1c8);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        if ((local_131 & 1) == 0) {
          pBVar3 = llbuild::buildsystem::BuildSystem::getDelegate((BuildSystem *)context_local);
          std::operator+(&local_258,"Stale file \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130);
          std::operator+(&local_238,&local_258,"\' is located outside of the allowed root paths.\n")
          ;
          local_218 = std::__cxx11::string::data();
          pvVar10 = (void *)std::__cxx11::string::length();
          (*pBVar3->_vptr_BuildSystemDelegate[0xd])(pBVar3,this,local_218);
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::string::~string((string *)&local_258);
        }
        else {
          local_268 = this_local;
          local_260 = ti_local.impl;
          ti_00.ctx = extraout_RDX;
          ti_00.impl = ti_local.impl;
          this_00 = getBuildSystem((anon_unknown_dwarf_145302 *)this_local,ti_00);
          pFVar8 = BuildSystemImpl::getFileSystem(this_00);
          uVar2 = (*pFVar8->_vptr_FileSystem[5])(pFVar8,local_130);
          if ((uVar2 & 1) == 0) {
            piVar9 = __errno_location();
            if (*piVar9 != 2) {
              pBVar3 = llbuild::buildsystem::BuildSystem::getDelegate((BuildSystem *)context_local);
              std::operator+(&local_348,"cannot remove stale file \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_130);
              std::operator+(&local_328,&local_348,"\': ");
              piVar9 = __errno_location();
              pcVar6 = strerror(*piVar9);
              std::operator+(&local_308,&local_328,pcVar6);
              std::operator+(&local_2e8,&local_308,"\n");
              local_2c8 = std::__cxx11::string::data();
              pvVar10 = (void *)std::__cxx11::string::length();
              (*pBVar3->_vptr_BuildSystemDelegate[0xd])(pBVar3,this,local_2c8);
              std::__cxx11::string::~string((string *)&local_2e8);
              std::__cxx11::string::~string((string *)&local_308);
              std::__cxx11::string::~string((string *)&local_328);
              std::__cxx11::string::~string((string *)&local_348);
            }
          }
          else {
            pBVar3 = llbuild::buildsystem::BuildSystem::getDelegate((BuildSystem *)context_local);
            std::operator+(&local_2b8,"Removed stale file \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_130);
            std::operator+(&local_298,&local_2b8,"\'\n");
            local_278 = std::__cxx11::string::data();
            pvVar10 = (void *)std::__cxx11::string::length();
            (*pBVar3->_vptr_BuildSystemDelegate[0xc])(pBVar3,this,local_278);
            std::__cxx11::string::~string((string *)&local_298);
            std::__cxx11::string::~string((string *)&local_2b8);
          }
        }
      }
      else {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_130);
        pvVar10 = (void *)0x0;
        lVar7 = std::__cxx11::string::find((char)this + 'H',(ulong)(uint)(int)*pcVar6);
        if (lVar7 != -1) goto LAB_0019725a;
        pBVar3 = llbuild::buildsystem::BuildSystem::getDelegate((BuildSystem *)context_local);
        std::operator+(&local_188,"Stale file \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130);
        std::operator+(&local_168,&local_188,
                       "\' has a relative path. This is invalid in combination with the root path attribute.\n"
                      );
        ti_local.ctx = &local_168;
        local_148 = std::__cxx11::string::data();
        pvVar10 = (void *)std::__cxx11::string::length();
        (*pBVar3->_vptr_BuildSystemDelegate[0xd])(pBVar3,this,local_148);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_188);
      }
      std::__cxx11::string::~string((string *)local_130);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    pBVar3 = llbuild::buildsystem::BuildSystem::getDelegate((BuildSystem *)context_local);
    (*pBVar3->_vptr_BuildSystemDelegate[0xe])(pBVar3,this,0);
    llvm::ArrayRef<std::__cxx11::string>::ArrayRef<std::allocator<std::__cxx11::string>>
              ((ArrayRef<std::__cxx11::string> *)&local_3c8,&this->expectedOutputs);
    values_00.Length = (size_type)pvVar10;
    values_00.Data = local_3c0;
    llbuild::buildsystem::BuildValue::makeStaleFileRemoval(&local_3b8,local_3c8,values_00);
    std::function<void_(llbuild::buildsystem::BuildValue_&&)>::operator()(resultFn,&local_3b8);
    llbuild::buildsystem::BuildValue::~BuildValue(&local_3b8);
  }
  return;
}

Assistant:

virtual void execute(BuildSystem& system,
                       TaskInterface ti,
                       QueueJobContext* context,
                       ResultFn resultFn) override {
    // Nothing to do if we do not have a prior result.
    if (!hasPriorResult || !priorValue.isStaleFileRemoval()) {
      system.getDelegate().commandStarted(this);
      system.getDelegate().commandFinished(this, ProcessStatus::Succeeded);
      resultFn(BuildValue::makeStaleFileRemoval(expectedOutputs));
      return;
    }

    computeFilesToDelete();

    system.getDelegate().commandStarted(this);

    for (auto fileToDelete : filesToDelete) {
      // If no root paths are specified, any path is valid.
      bool isLocatedUnderRootPath = roots.size() == 0 ? true : false;

      // If root paths are defined, stale file paths should be absolute.
      if (roots.size() > 0 &&
          pathSeparators.find(fileToDelete[0]) == std::string::npos) {
        system.getDelegate().commandHadWarning(this, "Stale file '" + fileToDelete + "' has a relative path. This is invalid in combination with the root path attribute.\n");
        continue;
      }

      // Check if the file is located under one of the allowed root paths.
      for (auto root : roots) {
        if (pathIsPrefixedByPath(fileToDelete, root)) {
          isLocatedUnderRootPath = true;
        }
      }

      if (!isLocatedUnderRootPath) {
        system.getDelegate().commandHadWarning(this, "Stale file '" + fileToDelete + "' is located outside of the allowed root paths.\n");
        continue;
      }

      if (getBuildSystem(ti).getFileSystem().remove(fileToDelete)) {
        system.getDelegate().commandHadNote(this, "Removed stale file '" + fileToDelete + "'\n");
      } else {
        // Do not warn if the file has already been deleted.
        if (errno != ENOENT) {
          system.getDelegate().commandHadWarning(this, "cannot remove stale file '" + fileToDelete + "': " + strerror(errno) + "\n");
        }
      }
    }

    system.getDelegate().commandFinished(this, ProcessStatus::Succeeded);

    // Complete with a successful result.
    resultFn(BuildValue::makeStaleFileRemoval(expectedOutputs));
  }